

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearSystem::dynamics
          (LinearSystem *this,VectorDynSize *state,double time,VectorDynSize *stateDynamics)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 extraout_var_00;
  VectorDynSize *vec;
  VectorDynSize *pVVar7;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *pMVar8;
  DynamicalSystem *in_RDI;
  double in_XMM0_Qa;
  ostringstream errorMsg_3;
  ostringstream errorMsg_2;
  MatrixDynSize *controlMatrix;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *stateMatrix;
  bool isValid;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
  *in_stack_fffffffffffff758;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff760;
  ostringstream *poVar9;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff780;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff788;
  string local_6b0 [32];
  ostringstream local_690 [376];
  string local_518 [32];
  ostringstream local_4f8 [376];
  undefined8 local_380;
  string local_378 [32];
  ostringstream local_358 [376];
  string local_1e0 [48];
  ostringstream local_1b0 [376];
  undefined8 local_38;
  byte local_29 [9];
  double local_20;
  byte local_1;
  
  local_29[0] = 0;
  local_20 = in_XMM0_Qa;
  peVar2 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e9f19);
  iVar1 = (*peVar2->_vptr_TimeVaryingObject[2])(local_20,peVar2,local_29);
  local_38 = CONCAT44(extraout_var,iVar1);
  if ((local_29[0] & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar3 = std::operator<<((ostream *)local_1b0,
                             "Unable to retrieve a valid state matrix at time: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,".");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("LinearSystem","dynamics",pcVar4);
    std::__cxx11::string::~string(local_1e0);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    goto LAB_002ea53e;
  }
  sVar5 = iDynTree::MatrixDynSize::rows();
  sVar6 = DynamicalSystem::stateSpaceSize(in_RDI);
  if (sVar5 == sVar6) {
    sVar5 = iDynTree::MatrixDynSize::cols();
    sVar6 = DynamicalSystem::stateSpaceSize(in_RDI);
    if (sVar5 == sVar6) {
      local_29[0] = 0;
      peVar2 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ea1c8);
      iVar1 = (*peVar2->_vptr_TimeVaryingObject[2])(local_20,peVar2,local_29);
      local_380 = CONCAT44(extraout_var_00,iVar1);
      if ((local_29[0] & 1) == 0) {
        poVar9 = local_4f8;
        std::__cxx11::ostringstream::ostringstream(poVar9);
        poVar3 = std::operator<<((ostream *)poVar9,
                                 "Unable to retrieve a valid control matrix at time: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
        std::operator<<(poVar3,".");
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("LinearSystem","dynamics",pcVar4);
        std::__cxx11::string::~string(local_518);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_4f8);
      }
      else {
        vec = (VectorDynSize *)iDynTree::MatrixDynSize::rows();
        pVVar7 = (VectorDynSize *)DynamicalSystem::stateSpaceSize(in_RDI);
        if (vec == pVVar7) {
          other = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::MatrixDynSize::cols();
          pMVar8 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)DynamicalSystem::controlSpaceSize(in_RDI);
          if (other == pMVar8) {
            toEigen((MatrixDynSize *)in_stack_fffffffffffff788);
            toEigen(vec);
            Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
            operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)vec,other);
            toEigen((MatrixDynSize *)in_stack_fffffffffffff788);
            (*in_RDI->_vptr_DynamicalSystem[4])();
            toEigen(vec);
            Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
            operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)vec,other);
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,0>>
            ::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            toEigen(vec);
            Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                      (in_stack_fffffffffffff760,in_stack_fffffffffffff758);
            local_1 = 1;
            goto LAB_002ea53e;
          }
        }
        poVar9 = local_690;
        std::__cxx11::ostringstream::ostringstream(poVar9);
        poVar3 = std::operator<<((ostream *)poVar9,"The control matrix at time: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
        std::operator<<(poVar3,
                        " has dimensions not matching with the specified state/control space dimension."
                       );
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("LinearSystem","dynamics",pcVar4);
        std::__cxx11::string::~string(local_6b0);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_690);
      }
      goto LAB_002ea53e;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_358);
  poVar3 = std::operator<<((ostream *)local_358,"The state matrix at time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
  std::operator<<(poVar3," has dimensions not matching with the specified state space dimension.");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iDynTree::reportError("LinearSystem","dynamics",pcVar4);
  std::__cxx11::string::~string(local_378);
  local_1 = 0;
  std::__cxx11::ostringstream::~ostringstream(local_358);
LAB_002ea53e:
  return (bool)(local_1 & 1);
}

Assistant:

bool LinearSystem::dynamics(const VectorDynSize& state,
                                    double time,
                                    VectorDynSize& stateDynamics)
        {
            bool isValid = false;
            const MatrixDynSize& stateMatrix = m_pimpl->stateMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid state matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((stateMatrix.rows() != stateSpaceSize()) || (stateMatrix.cols() != stateSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The state matrix at time: " << time << " has dimensions not matching with the specified state space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            isValid = false;
            const MatrixDynSize& controlMatrix = m_pimpl->controlMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid control matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((controlMatrix.rows() != stateSpaceSize()) || (controlMatrix.cols() != controlSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The control matrix at time: " << time << " has dimensions not matching with the specified state/control space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            iDynTree::toEigen(stateDynamics) = iDynTree::toEigen(stateMatrix) * iDynTree::toEigen(state) + iDynTree::toEigen(controlMatrix) * iDynTree::toEigen(controlInput());
            return true;
        }